

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Electrostatic.cpp
# Opt level: O3

void __thiscall OpenMD::Electrostatic::ReciprocalSpaceSum(Electrostatic *this,RealType *pot)

{
  undefined1 *puVar1;
  pointer *ppdVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  double dVar7;
  double dVar8;
  bool bVar9;
  bool bVar10;
  bool bVar11;
  pointer ppAVar12;
  pointer pEVar13;
  Snapshot *pSVar14;
  double dVar15;
  undefined1 auVar16 [16];
  uint i;
  int iVar17;
  long lVar18;
  void *__s;
  Molecule *pMVar19;
  Molecule *pMVar20;
  value_type_conflict1 *pvVar21;
  uint i_3;
  pointer pdVar22;
  double *pdVar23;
  uint i_5;
  int iVar24;
  pointer pdVar25;
  pointer ppAVar26;
  pointer pdVar27;
  value_type_conflict1 *pvVar28;
  value_type_conflict1 *pvVar29;
  uint i_11;
  pointer pdVar30;
  uint i_10;
  long lVar31;
  pointer pdVar32;
  long lVar33;
  Atom *pAVar34;
  long lVar35;
  pointer pvVar36;
  double (*__return_storage_ptr__) [3];
  size_type sVar37;
  byte bVar38;
  undefined4 uVar39;
  double tmp;
  undefined4 uVar40;
  undefined4 uVar41;
  undefined4 uVar42;
  double dVar43;
  double dVar44;
  MoleculeIterator mi;
  RectMatrix<double,_3U,_3U> result_1;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ems;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  els;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  enc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  emc;
  vector<double,_std::allocator<double>_> skr;
  vector<double,_std::allocator<double>_> ckr;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  ens;
  vector<double,_std::allocator<double>_> qks;
  vector<double,_std::allocator<double>_> qkc;
  vector<double,_std::allocator<double>_> dks;
  vector<double,_std::allocator<double>_> dkc;
  vector<double,_std::allocator<double>_> cks;
  vector<double,_std::allocator<double>_> ckc;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  elc;
  Mat3x3d Q;
  Vector3d D;
  Vector3d Qk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> qxk;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> dxk;
  vector<double,_std::allocator<double>_> slm;
  vector<double,_std::allocator<double>_> clm;
  Vector3d tt;
  Vector3d r;
  Mat3x3d hmat;
  MoleculeIterator local_538;
  pointer local_530;
  pointer local_528;
  pointer pdStack_520;
  double local_510;
  pointer local_508;
  double dStack_500;
  pointer local_4f8;
  pointer local_4f0;
  pointer local_4e8;
  void *local_4e0;
  pointer local_4d8;
  pointer local_4d0;
  double local_4c8 [10];
  pointer local_478;
  double dStack_470;
  double local_468;
  Molecule *local_460;
  pointer local_458;
  pointer local_450;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_448;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_428;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_408;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_3e8;
  vector<double,_std::allocator<double>_> local_3c8;
  vector<double,_std::allocator<double>_> local_3b0;
  undefined1 local_398 [16];
  pointer local_388;
  double dStack_380;
  pointer local_378;
  pointer pdStack_370;
  pointer local_368;
  undefined8 uStack_360;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_358;
  double local_338;
  pointer local_330;
  pointer local_328;
  double dStack_320;
  vector<double,_std::allocator<double>_> local_318;
  vector<double,_std::allocator<double>_> local_300;
  vector<double,_std::allocator<double>_> local_2e8;
  vector<double,_std::allocator<double>_> local_2d0;
  vector<double,_std::allocator<double>_> local_2b8;
  vector<double,_std::allocator<double>_> local_2a0;
  vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
  local_288;
  value_type_conflict1 local_268;
  pointer pvStack_260;
  pointer local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  pointer local_218;
  undefined8 uStack_210;
  double local_208 [4];
  double local_1e8 [4];
  double local_1c8;
  pointer pvStack_1c0;
  pointer local_1b8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_1a8;
  vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_> local_190;
  vector<double,_std::allocator<double>_> local_178;
  vector<double,_std::allocator<double>_> local_160;
  double local_148 [10];
  double local_f8 [4];
  Vector3d local_d8;
  double *local_b8;
  double local_b0;
  size_type local_a8;
  double local_a0;
  double local_98;
  double local_90 [3];
  Mat3x3d local_78;
  
  bVar38 = 0;
  local_b8 = pot;
  Snapshot::getHmat(&local_78,this->info_->sman_->currentSnapshot_);
  local_268 = 0.0;
  pvStack_260 = (pointer)0x0;
  local_258 = (pointer)0x0;
  lVar18 = 0;
  do {
    *(undefined8 *)((long)&local_268 + lVar18) =
         *(undefined8 *)
          ((long)local_78.super_SquareMatrix<double,_3>.super_RectMatrix<double,_3U,_3U>.data_[0] +
          lVar18 * 4);
    lVar18 = lVar18 + 8;
  } while (lVar18 != 0x18);
  local_1b8 = local_258;
  local_1c8 = local_268;
  pvStack_1c0 = pvStack_260;
  lVar18 = 0;
  local_510 = local_268;
  uVar41 = SUB84(local_268,0);
  uVar42 = (int)((ulong)local_268 >> 0x20);
  do {
    dVar3 = (&local_1c8)[lVar18];
    uVar39 = SUB84(dVar3,0);
    uVar40 = (int)((ulong)dVar3 >> 0x20);
    if (dVar3 <= (double)CONCAT44(uVar42,uVar41)) {
      uVar39 = uVar41;
      uVar40 = uVar42;
    }
    lVar18 = lVar18 + 1;
    uVar41 = uVar39;
    uVar42 = uVar40;
  } while (lVar18 != 3);
  local_528 = (pointer)CONCAT44(uVar40,uVar39);
  __s = operator_new(0x1a0);
  memset(__s,0,0x1a0);
  if (1e-12 <= (double)this->dampingAlpha_) {
    local_478 = pvStack_1c0;
    local_508 = (pointer)local_1b8;
    local_288.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_288.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_3e8.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_408.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_408.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_408.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_428.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_428.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_428.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_448.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_448.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_448.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_358.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_358.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_358.
    super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    sVar37 = (size_type)this->info_->nAtoms_;
    local_530 = (pointer)this->dampingAlpha_;
    local_4e0 = __s;
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_288,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_3e8,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_408,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_428,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_448,9);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::resize(&local_358,9);
    local_b0 = 6.283185307179586 / local_510;
    local_a0 = 6.283185307179586 / (double)local_478;
    local_98 = 6.283185307179586 / (double)local_508;
    local_468 = 6.283185307179586 / (double)local_528;
    local_510 = 6.283185307179586 / (local_510 * (double)local_478 * (double)local_508);
    local_338 = -0.25 / ((double)local_530 * (double)local_530);
    lVar18 = 0;
    do {
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_288.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_3e8.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_408.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_428.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_448.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      std::vector<double,_std::allocator<double>_>::resize
                ((vector<double,_std::allocator<double>_> *)
                 ((long)&((local_358.
                           super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                           ._M_impl.super__Vector_impl_data._M_start)->
                         super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_start + lVar18),sVar37);
      lVar18 = lVar18 + 0x18;
    } while (lVar18 != 0xd8);
    local_90[0] = 6.283185307179586;
    local_90[1] = 6.283185307179586;
    local_90[2] = 6.283185307179586;
    lVar18 = 0;
    do {
      local_90[lVar18] = local_90[lVar18] / (&local_1c8)[lVar18];
      lVar18 = lVar18 + 1;
    } while (lVar18 != 3);
    local_538._M_node = (_Base_ptr)0x0;
    local_d8.super_Vector<double,_3U>.data_[2] = 0.0;
    local_d8.super_Vector<double,_3U>.data_[0] = 0.0;
    local_d8.super_Vector<double,_3U>.data_[1] = 0.0;
    local_f8[2] = 0.0;
    local_f8[0] = 0.0;
    local_f8[1] = 0.0;
    pMVar19 = SimInfo::beginMolecule(this->info_,&local_538);
    uVar41 = SUB84(local_338,0);
    uVar42 = (undefined4)((ulong)local_338 >> 0x20);
    local_a8 = sVar37;
    while (sVar37 = local_a8, pMVar19 != (Molecule *)0x0) {
      ppAVar26 = (pMVar19->atoms_).
                 super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                 super__Vector_impl_data._M_start;
      if (ppAVar26 !=
          (pMVar19->atoms_).super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
          _M_impl.super__Vector_impl_data._M_finish) {
        pAVar34 = *ppAVar26;
        local_460 = pMVar19;
        while (pAVar34 != (Atom *)0x0) {
          lVar35 = (long)(pAVar34->super_StuntDouble).localIndex_;
          lVar18 = *(long *)((long)&(((pAVar34->super_StuntDouble).snapshotMan_)->currentSnapshot_->
                                    atomData).position.
                                    super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                    ._M_impl.super__Vector_impl_data._M_start +
                            (pAVar34->super_StuntDouble).storage_);
          pdVar23 = (double *)(lVar18 + lVar35 * 0x18);
          local_d8.super_Vector<double,_3U>.data_[0] = *pdVar23;
          local_d8.super_Vector<double,_3U>.data_[1] = pdVar23[1];
          local_d8.super_Vector<double,_3U>.data_[2] = *(double *)(lVar18 + 0x10 + lVar35 * 0x18);
          Snapshot::wrapVector(this->info_->sman_->currentSnapshot_,&local_d8);
          local_458 = ppAVar26;
          lVar18 = 0;
          do {
            local_f8[lVar18] = local_90[lVar18] * local_d8.super_Vector<double,_3U>.data_[lVar18];
            lVar18 = lVar18 + 1;
          } while (lVar18 != 3);
          local_288.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 1.0;
          local_3e8.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 1.0;
          local_408.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 1.0;
          local_428.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 0.0;
          local_448.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 0.0;
          local_358.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[1].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = 0.0;
          local_528 = (pointer)local_f8[0];
          dVar3 = cos(local_f8[0]);
          local_288.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = dVar3;
          local_530 = (pointer)local_f8[1];
          dVar3 = cos(local_f8[1]);
          local_3e8.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = dVar3;
          local_508 = (pointer)local_f8[2];
          dVar3 = cos(local_f8[2]);
          local_408.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = dVar3;
          dVar3 = sin((double)local_528);
          local_428.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = dVar3;
          dVar3 = sin((double)local_530);
          local_448.
          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
          ._M_impl.super__Vector_impl_data._M_start[2].
          super__Vector_base<double,_std::allocator<double>_>._M_impl.super__Vector_impl_data.
          _M_start[lVar35] = dVar3;
          dVar3 = sin((double)local_508);
          local_478 = local_358.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_368 = local_358.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_368[lVar35] = dVar3;
          local_378 = local_288.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_388 = local_288.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_398._0_8_ =
               local_428.
               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start;
          local_4d0 = local_428.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_4e8 = local_3e8.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_4f0 = (pointer)local_3e8.
                               super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                               ._M_impl.super__Vector_impl_data._M_start[2].
                               super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_start;
          local_4d8 = local_448.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_218 = local_448.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          local_4f8 = local_408.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start;
          local_450 = local_408.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[2].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
          lVar18 = 0x48;
          pdVar22 = local_368;
          pdVar25 = local_218;
          pdVar27 = local_450;
          pdVar30 = local_4d0;
          ppAVar26 = local_4f0;
          pdVar32 = local_388;
          do {
            local_508 = (pointer)pdVar27;
            local_528 = *(pointer *)
                         ((long)&((local_288.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar18);
            local_528[lVar35] =
                 pdVar32[lVar35] * local_388[lVar35] - local_4d0[lVar35] * pdVar30[lVar35];
            local_530 = *(pointer *)
                         ((long)&((local_3e8.
                                   super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                   ._M_impl.super__Vector_impl_data._M_start)->
                                 super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                 super__Vector_impl_data._M_start + lVar18);
            local_530[lVar35] =
                 (Atom *)((double)ppAVar26[lVar35] * (double)local_4f0[lVar35] -
                         local_218[lVar35] * pdVar25[lVar35]);
            pdVar27 = *(pointer *)
                       ((long)&((local_408.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar18);
            pdVar27[lVar35] =
                 *(double *)((long)local_508 + lVar35 * 8) * local_450[lVar35] -
                 local_368[lVar35] * pdVar22[lVar35];
            pdVar23 = pdVar30 + lVar35;
            pdVar30 = *(pointer *)
                       ((long)&((local_428.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar18);
            pdVar30[lVar35] = *pdVar23 * local_388[lVar35] + pdVar32[lVar35] * local_4d0[lVar35];
            pdVar23 = pdVar25 + lVar35;
            pdVar25 = *(pointer *)
                       ((long)&((local_448.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar18);
            pdVar25[lVar35] =
                 *pdVar23 * (double)local_4f0[lVar35] + (double)ppAVar26[lVar35] * local_218[lVar35]
            ;
            pdVar23 = pdVar22 + lVar35;
            pdVar22 = *(pointer *)
                       ((long)&((local_358.
                                 super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                 ._M_impl.super__Vector_impl_data._M_start)->
                               super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                               super__Vector_impl_data._M_start + lVar18);
            pdVar22[lVar35] =
                 *pdVar23 * local_450[lVar35] +
                 *(double *)((long)local_508 + lVar35 * 8) * local_368[lVar35];
            lVar18 = lVar18 + 0x18;
            ppAVar26 = local_530;
            pdVar32 = local_528;
          } while (lVar18 != 0xd8);
          ppAVar26 = local_458 + 1;
          if (ppAVar26 ==
              (local_460->atoms_).
              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
              super__Vector_impl_data._M_finish) break;
          pAVar34 = *ppAVar26;
        }
      }
      pMVar19 = SimInfo::nextMolecule(this->info_,&local_538);
      uVar41 = SUB84(local_338,0);
      uVar42 = (undefined4)((ulong)local_338 >> 0x20);
    }
    uVar39 = 0;
    uVar40 = 0;
    if ((double)CONCAT44(uVar42,uVar41) <= 0.0 && (double)CONCAT44(uVar42,uVar41) != 0.0) {
      dVar3 = exp((double)CONCAT44(uVar42,uVar41) * local_468 * local_468);
      uVar39 = SUB84(dVar3,0);
      uVar40 = (undefined4)((ulong)dVar3 >> 0x20);
    }
    dVar3 = 1.0;
    lVar18 = 1;
    do {
      dVar3 = dVar3 * (double)CONCAT44(uVar40,uVar39);
      *(double *)((long)local_4e0 + lVar18 * 8) =
           (dVar3 * 332.0637778) / ((double)(int)lVar18 * local_468 * local_468);
      lVar18 = lVar18 + 1;
    } while (lVar18 != 0x34);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_160,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_178,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_3b0,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_3c8,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2a0,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2b8,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2d0,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_2e8,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_300,sVar37,&local_268,(allocator_type *)local_4c8);
    local_268 = 0.0;
    std::vector<double,_std::allocator<double>_>::vector
              (&local_318,sVar37,&local_268,(allocator_type *)local_4c8);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_190,sVar37,(value_type *)OpenMD::V3Zero,(allocator_type *)&local_268);
    std::vector<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>::vector
              (&local_1a8,sVar37,(value_type *)OpenMD::V3Zero,(allocator_type *)&local_268);
    local_1e8[2] = 0.0;
    local_1e8[0] = 0.0;
    local_1e8[1] = 0.0;
    local_208[2] = 0.0;
    local_208[0] = 0.0;
    local_208[1] = 0.0;
    local_228 = 0;
    local_238 = 0;
    uStack_230 = 0;
    local_248 = 0;
    uStack_240 = 0;
    local_258 = (pointer)0x0;
    uStack_250 = 0;
    local_268 = 0.0;
    pvStack_260 = (pointer)0x0;
    local_4d0 = (pointer)(local_510 + local_510);
    local_510 = local_510 * 4.0;
    pvVar36 = (pointer)0x9;
    pdVar27 = (pointer)0x8;
    local_4f8 = (pointer)0x0;
    pMVar19 = (Molecule *)0x1;
    do {
      puVar1 = (undefined1 *)((long)&pMVar19[-1].molStamp_ + 7);
      local_218 = (pointer)((double)(int)puVar1 * local_b0);
      uStack_210 = 0;
      local_458 = (pointer)((long)puVar1 * (long)puVar1);
      local_460 = pMVar19;
      do {
        pMVar19 = local_460;
        pMVar20 = SimInfo::beginMolecule(this->info_,&local_538);
        local_4f0 = (pointer)(pdVar27 + -1);
        iVar17 = (int)local_4f0;
        local_4d8 = (pointer)((double)iVar17 * local_a0);
        iVar24 = -iVar17;
        if (0 < iVar17) {
          iVar24 = iVar17;
        }
        local_528 = (pointer)((ulong)(iVar24 + 1) << 3);
        while (pMVar20 != (Molecule *)0x0) {
          ppAVar26 = (pMVar20->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_start;
          ppAVar12 = (pMVar20->atoms_).
                     super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                     super__Vector_impl_data._M_finish;
          if ((ppAVar26 != ppAVar12) && (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0)) {
            pdVar30 = local_288.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pMVar19].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar18 = *(long *)((long)&((local_3e8.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start + (long)local_528 * 3);
            pdVar25 = local_428.
                      super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                      ._M_impl.super__Vector_impl_data._M_start[(long)pMVar19].
                      super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start;
            lVar35 = *(long *)((long)&((local_448.
                                        super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                                        ._M_impl.super__Vector_impl_data._M_start)->
                                      super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                                      super__Vector_impl_data._M_start + (long)local_528 * 3);
            do {
              ppAVar26 = ppAVar26 + 1;
              lVar33 = (long)(pAVar34->super_StuntDouble).localIndex_;
              dVar3 = *(double *)(lVar35 + lVar33 * 8);
              dVar15 = *(double *)(lVar18 + lVar33 * 8) * pdVar30[lVar33];
              if (pdVar27 < (pointer)0x8) {
                local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar33] = dVar15 + pdVar25[lVar33] * dVar3;
                dVar3 = pdVar25[lVar33] * *(double *)(lVar18 + lVar33 * 8) -
                        pdVar30[lVar33] * *(double *)(lVar35 + lVar33 * 8);
              }
              else {
                local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start[lVar33] = dVar15 - dVar3 * pdVar25[lVar33];
                dVar3 = pdVar25[lVar33] * *(double *)(lVar18 + lVar33 * 8) +
                        *(double *)(lVar35 + lVar33 * 8) * pdVar30[lVar33];
              }
              local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
              super__Vector_impl_data._M_start[lVar33] = dVar3;
            } while ((ppAVar26 != ppAVar12) && (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0));
          }
          pMVar20 = SimInfo::nextMolecule(this->info_,&local_538);
        }
        local_4f0 = (pointer)((long)local_4f0 * (long)local_4f0 + (long)local_458);
        local_450 = pdVar27;
        do {
          ppdVar2 = &pvVar36[-1].super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
          iVar17 = (int)ppdVar2;
          iVar24 = -iVar17;
          if (0 < iVar17) {
            iVar24 = iVar17;
          }
          local_530 = (pointer)((long)ppdVar2 * (long)ppdVar2 + (long)local_4f0);
          if (local_530 < (pointer)0x34) {
            local_528 = (pointer)((double)iVar17 * local_98);
            local_330 = local_218;
            local_328 = local_4d8;
            pdStack_520 = (pointer)0x0;
            dStack_320 = (double)local_528;
            pMVar19 = SimInfo::beginMolecule(this->info_,&local_538);
            local_4e8 = pvVar36;
            while (pMVar19 != (Molecule *)0x0) {
              ppAVar26 = (pMVar19->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_start;
              ppAVar12 = (pMVar19->atoms_).
                         super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl
                         .super__Vector_impl_data._M_finish;
              if ((ppAVar26 != ppAVar12) && (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0)) {
                pdVar27 = local_408.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar24 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                pdVar30 = local_358.
                          super__Vector_base<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[iVar24 + 1U].
                          super__Vector_base<double,_std::allocator<double>_>._M_impl.
                          super__Vector_impl_data._M_start;
                do {
                  ppAVar26 = ppAVar26 + 1;
                  iVar17 = (pAVar34->super_StuntDouble).localIndex_;
                  if (local_4e8 < (pointer)0x8) {
                    local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar17] =
                         local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17] * pdVar27[iVar17] +
                         local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17] * pdVar30[iVar17];
                    dVar3 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar17] * pdVar27[iVar17] -
                            pdVar30[iVar17] *
                            local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar17];
                  }
                  else {
                    local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start[iVar17] =
                         local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17] * pdVar27[iVar17] -
                         pdVar30[iVar17] *
                         local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17];
                    dVar3 = local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar17] * pdVar27[iVar17] +
                            local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start[iVar17] * pdVar30[iVar17];
                  }
                  local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar17] = dVar3;
                  pvVar36 = local_4e8;
                } while ((ppAVar26 != ppAVar12) && (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0));
              }
              pMVar19 = SimInfo::nextMolecule(this->info_,&local_538);
            }
            pMVar19 = SimInfo::beginMolecule(this->info_,&local_538);
            local_368 = local_330;
            uStack_360 = 0;
            local_378 = (pointer)dStack_320;
            pdStack_370 = local_330;
            local_388 = (pointer)-dStack_320;
            dStack_380 = -(double)local_330;
            local_478 = local_328;
            dStack_470 = dStack_320;
            local_398._8_4_ = SUB84(dStack_320,0);
            local_398._0_8_ = -(double)local_328;
            local_398._12_4_ = (uint)((ulong)dStack_320 >> 0x20) ^ 0x80000000;
            pdStack_520 = local_218;
            local_508 = local_4d8;
            dStack_500 = 0.0;
            while (pMVar19 != (Molecule *)0x0) {
              for (ppAVar26 = (pMVar19->atoms_).
                              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  (ppAVar26 !=
                   (pMVar19->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_finish &&
                  (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0)); ppAVar26 = ppAVar26 + 1) {
                iVar24 = (pAVar34->super_StuntDouble).localIndex_;
                iVar17 = AtomType::getIdent(pAVar34->atomType_);
                pEVar13 = (this->ElectrostaticMap).
                          super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar17 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17];
                bVar9 = pEVar13[iVar17].is_Dipole;
                bVar10 = pEVar13[iVar17].is_Quadrupole;
                if ((pEVar13[iVar17].is_Charge & 1U) != 0) {
                  dVar3 = pEVar13[iVar17].fixedCharge;
                  if ((pEVar13[iVar17].is_Fluctuating & 1U) != 0) {
                    dVar3 = dVar3 + *(double *)
                                     (*(long *)((long)&(((pAVar34->super_StuntDouble).snapshotMan_)
                                                        ->currentSnapshot_->atomData).flucQPos.
                                                                                                              
                                                  super__Vector_base<double,_std::allocator<double>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                               (pAVar34->super_StuntDouble).storage_) +
                                     (long)(pAVar34->super_StuntDouble).localIndex_ * 8);
                  }
                  local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar24] * dVar3;
                  local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       dVar3 * local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[iVar24];
                }
                if ((bVar9 & 1U) != 0) {
                  lVar35 = (long)(pAVar34->super_StuntDouble).localIndex_;
                  lVar18 = *(long *)((long)&(((pAVar34->super_StuntDouble).snapshotMan_)->
                                             currentSnapshot_->atomData).dipole.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    (pAVar34->super_StuntDouble).storage_);
                  local_148[2] = *(double *)(lVar18 + 0x10 + lVar35 * 0x18);
                  pdVar23 = (double *)(lVar18 + lVar35 * 0x18);
                  local_148[0] = *pdVar23;
                  local_148[1] = pdVar23[1];
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar18 = 0;
                  do {
                    local_4c8[lVar18] = local_148[lVar18] * 0.20819434;
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  local_208[2] = local_4c8[2];
                  local_208[0] = local_4c8[0];
                  local_208[1] = local_4c8[1];
                  dVar3 = 0.0;
                  lVar18 = 0;
                  do {
                    dVar3 = dVar3 + local_208[lVar18] * (double)(&local_330)[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  dVar15 = local_4c8[2] * (double)pdStack_520 - (double)local_528 * local_4c8[0];
                  auVar16._8_4_ = SUB84(dVar15,0);
                  auVar16._0_8_ =
                       local_4c8[1] * (double)local_528 - (double)local_508 * local_4c8[2];
                  auVar16._12_4_ = (int)((ulong)dVar15 >> 0x20);
                  *(undefined1 (*) [16])
                   local_190.
                   super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                   ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.data_
                       = auVar16;
                  local_190.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.data_
                  [2] = local_4c8[0] * (double)local_508 - (double)pdStack_520 * local_4c8[1];
                  local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar24] * dVar3;
                  local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       dVar3 * local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[iVar24];
                }
                if ((bVar10 & 1U) != 0) {
                  __return_storage_ptr__ = (double (*) [3])local_148;
                  StuntDouble::getQuadrupole
                            ((Mat3x3d *)__return_storage_ptr__,&pAVar34->super_StuntDouble);
                  local_4c8[6] = 0.0;
                  local_4c8[7] = 0.0;
                  local_4c8[4] = 0.0;
                  local_4c8[5] = 0.0;
                  local_4c8[2] = 0.0;
                  local_4c8[3] = 0.0;
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[8] = 0.0;
                  pdVar23 = local_4c8;
                  lVar18 = 0;
                  do {
                    lVar35 = 0;
                    do {
                      pdVar23[lVar35] =
                           (((SquareMatrix<double,_3> *)*__return_storage_ptr__)->
                           super_RectMatrix<double,_3U,_3U>).data_[0][lVar35] * 0.20819434;
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != 3);
                    lVar18 = lVar18 + 1;
                    pdVar23 = pdVar23 + 3;
                    __return_storage_ptr__ = __return_storage_ptr__ + 1;
                  } while (lVar18 != 3);
                  pvVar21 = &local_268;
                  pvVar28 = local_4c8;
                  pvVar29 = pvVar21;
                  for (lVar18 = 9; lVar18 != 0; lVar18 = lVar18 + -1) {
                    *pvVar29 = *pvVar28;
                    pvVar28 = pvVar28 + (ulong)bVar38 * -2 + 1;
                    pvVar29 = pvVar29 + (ulong)bVar38 * -2 + 1;
                  }
                  local_4c8[0] = 0.0;
                  local_4c8[1] = 0.0;
                  local_4c8[2] = 0.0;
                  lVar18 = 0;
                  do {
                    dVar3 = local_4c8[lVar18];
                    lVar35 = 0;
                    do {
                      dVar3 = dVar3 + pvVar21[lVar35] * (double)(&local_330)[lVar35];
                      lVar35 = lVar35 + 1;
                    } while (lVar35 != 3);
                    local_4c8[lVar18] = dVar3;
                    lVar18 = lVar18 + 1;
                    pvVar21 = pvVar21 + 3;
                  } while (lVar18 != 3);
                  local_1e8[2] = local_4c8[2];
                  local_1e8[0] = local_4c8[0];
                  local_1e8[1] = local_4c8[1];
                  dVar3 = 0.0;
                  lVar18 = 0;
                  do {
                    dVar3 = dVar3 + (double)(&local_330)[lVar18] * local_1e8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  dVar44 = (double)local_368 * local_4c8[1];
                  dVar15 = local_4c8[0] * (double)local_398._0_8_;
                  dVar43 = local_4c8[0] * dStack_470;
                  local_4c8[0] = local_4c8[2] * (double)local_478 + local_4c8[1] * (double)local_388
                  ;
                  local_4c8[1] = dVar43 + local_4c8[2] * dStack_380;
                  local_4c8[2] = dVar15 + dVar44;
                  lVar18 = 0;
                  do {
                    local_4c8[lVar18] = -local_4c8[lVar18];
                    lVar18 = lVar18 + 1;
                  } while (lVar18 != 3);
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.data_
                  [2] = local_4c8[2];
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.data_
                  [0] = local_4c8[0];
                  local_1a8.
                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                  ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.data_
                  [1] = local_4c8[1];
                  local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start[iVar24] * dVar3;
                  local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_start[iVar24] =
                       dVar3 * local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl
                               .super__Vector_impl_data._M_start[iVar24];
                  local_508 = local_478;
                  dStack_500 = dStack_470;
                  local_528 = (pointer)local_378;
                  pdStack_520 = pdStack_370;
                }
              }
              pMVar19 = SimInfo::nextMolecule(this->info_,&local_538);
              pvVar36 = local_4e8;
            }
            local_528 = (pointer)0x0;
            local_508 = (pointer)0x0;
            for (pdVar23 = local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar23 !=
                local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar23 = pdVar23 + 1) {
              local_508 = (pointer)((double)local_508 + *pdVar23);
            }
            if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_528 = (pointer)0x0;
              pdVar27 = local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_528 = (pointer)((double)local_528 + *pdVar27);
                pdVar27 = pdVar27 + 1;
              } while (pdVar27 !=
                       local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_478 = (pointer)0x0;
            local_368 = (pointer)0x0;
            for (pdVar27 = local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar27 !=
                local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar27 = pdVar27 + 1) {
              local_368 = (pointer)((double)local_368 + *pdVar27);
            }
            if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_478 = (pointer)0x0;
              pdVar27 = local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_478 = (pointer)((double)local_478 + *pdVar27);
                pdVar27 = pdVar27 + 1;
              } while (pdVar27 !=
                       local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_388 = (pointer)0x0;
            local_378 = (pointer)0x0;
            for (pdVar27 = local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                pdVar27 !=
                local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish; pdVar27 = pdVar27 + 1) {
              local_378 = (pointer)((double)local_378 + *pdVar27);
            }
            if (local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start !=
                local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_finish) {
              local_388 = (pointer)0x0;
              pdVar27 = local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start;
              do {
                local_388 = (pointer)((double)local_388 + *pdVar27);
                pdVar27 = pdVar27 + 1;
              } while (pdVar27 !=
                       local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_finish);
            }
            local_398._0_8_ = *(double *)((long)local_4e0 + (long)local_530 * 8) * (double)local_4d0
            ;
            pMVar19 = SimInfo::beginMolecule(this->info_,&local_538);
            local_528 = (pointer)(((double)local_528 + (double)local_368) - (double)local_388);
            local_508 = (pointer)(((double)local_508 - (double)local_478) - (double)local_378);
            local_4f8 = (pointer)((double)local_4f8 +
                                 (double)local_398._0_8_ *
                                 ((double)local_528 * (double)local_528 +
                                 (double)local_508 * (double)local_508));
            while (pdVar27 = local_450, pMVar19 != (Molecule *)0x0) {
              for (ppAVar26 = (pMVar19->atoms_).
                              super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>.
                              _M_impl.super__Vector_impl_data._M_start;
                  (ppAVar26 !=
                   (pMVar19->atoms_).
                   super__Vector_base<OpenMD::Atom_*,_std::allocator<OpenMD::Atom_*>_>._M_impl.
                   super__Vector_impl_data._M_finish &&
                  (pAVar34 = *ppAVar26, pAVar34 != (Atom *)0x0)); ppAVar26 = ppAVar26 + 1) {
                iVar24 = (pAVar34->super_StuntDouble).localIndex_;
                iVar17 = AtomType::getIdent(pAVar34->atomType_);
                pEVar13 = (this->ElectrostaticMap).
                          super__Vector_base<OpenMD::ElectrostaticAtomData,_std::allocator<OpenMD::ElectrostaticAtomData>_>
                          ._M_impl.super__Vector_impl_data._M_start;
                iVar17 = (this->Etids).super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar17];
                bVar9 = pEVar13[iVar17].is_Dipole;
                bVar10 = pEVar13[iVar17].is_Quadrupole;
                bVar11 = pEVar13[iVar17].is_Fluctuating;
                dVar3 = *(double *)((long)local_4e0 + (long)local_530 * 8);
                dVar15 = local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                dVar43 = local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                dVar44 = local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_start[iVar24];
                dVar4 = local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
                dVar5 = local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
                dVar6 = local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
                dVar7 = local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
                dVar8 = local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                        super__Vector_impl_data._M_start[iVar24];
                local_148[0] = 0.0;
                local_148[1] = 0.0;
                local_148[2] = 0.0;
                lVar18 = 0;
                do {
                  local_148[lVar18] =
                       (double)(&local_330)[lVar18] *
                       (((dVar15 + dVar43) - dVar44) * (double)local_508 -
                       ((dVar4 - dVar5) - dVar6) * (double)local_528) * dVar3 * local_510;
                  lVar18 = lVar18 + 1;
                } while (lVar18 != 3);
                local_4c8[2] = local_148[2];
                local_4c8[0] = local_148[0];
                local_4c8[1] = local_148[1];
                pSVar14 = ((pAVar34->super_StuntDouble).snapshotMan_)->currentSnapshot_;
                lVar35 = (long)(pAVar34->super_StuntDouble).localIndex_;
                lVar18 = lVar35 * 0x18;
                lVar33 = *(long *)((long)&(pSVar14->atomData).force.
                                          super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                          ._M_impl.super__Vector_impl_data._M_start +
                                  (pAVar34->super_StuntDouble).storage_) + lVar18;
                lVar31 = 0;
                do {
                  *(double *)(lVar33 + lVar31 * 8) =
                       local_4c8[lVar31] + *(double *)(lVar33 + lVar31 * 8);
                  lVar31 = lVar31 + 1;
                } while (lVar31 != 3);
                dVar15 = (dVar3 + dVar3) * (dVar8 * (double)local_508 + (double)local_528 * dVar7);
                if ((bVar11 & 1U) != 0) {
                  lVar33 = *(long *)((long)&(pSVar14->atomData).flucQFrc.
                                            super__Vector_base<double,_std::allocator<double>_>.
                                            _M_impl.super__Vector_impl_data._M_start +
                                    (pAVar34->super_StuntDouble).storage_);
                  *(double *)(lVar33 + lVar35 * 8) =
                       *(double *)(lVar33 + lVar35 * 8) - (double)local_4d0 * dVar15;
                }
                if ((bVar9 & 1U) != 0) {
                  local_148[0] = 0.0;
                  local_148[1] = 0.0;
                  local_148[2] = 0.0;
                  lVar35 = 0;
                  do {
                    local_148[lVar35] =
                         local_190.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.
                         data_[lVar35] *
                         (dVar7 * (double)local_508 - (double)local_528 * dVar8) * dVar3 * local_510
                    ;
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 3);
                  local_4c8[2] = local_148[2];
                  local_4c8[0] = local_148[0];
                  local_4c8[1] = local_148[1];
                  lVar35 = *(long *)((long)&(pSVar14->atomData).torque.
                                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                            ._M_impl.super__Vector_impl_data._M_start +
                                    (pAVar34->super_StuntDouble).storage_) + lVar18;
                  lVar33 = 0;
                  do {
                    *(double *)(lVar35 + lVar33 * 8) =
                         local_4c8[lVar33] + *(double *)(lVar35 + lVar33 * 8);
                    lVar33 = lVar33 + 1;
                  } while (lVar33 != 3);
                }
                if ((bVar10 & 1U) != 0) {
                  local_148[0] = 0.0;
                  local_148[1] = 0.0;
                  local_148[2] = 0.0;
                  lVar35 = 0;
                  do {
                    local_148[lVar35] =
                         local_1a8.
                         super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                         ._M_impl.super__Vector_impl_data._M_start[iVar24].super_Vector<double,_3U>.
                         data_[lVar35] * dVar15 * local_510;
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 3);
                  local_4c8[2] = local_148[2];
                  local_4c8[0] = local_148[0];
                  local_4c8[1] = local_148[1];
                  lVar18 = lVar18 + *(long *)((long)&(pSVar14->atomData).torque.
                                                                                                          
                                                  super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                                                  ._M_impl.super__Vector_impl_data._M_start +
                                             (pAVar34->super_StuntDouble).storage_);
                  lVar35 = 0;
                  do {
                    *(double *)(lVar18 + lVar35 * 8) =
                         local_4c8[lVar35] + *(double *)(lVar18 + lVar35 * 8);
                    lVar35 = lVar35 + 1;
                  } while (lVar35 != 3);
                }
                local_4c8[0] = local_148[0];
                local_4c8[1] = local_148[1];
                local_4c8[2] = local_148[2];
              }
              pMVar19 = SimInfo::nextMolecule(this->info_,&local_538);
              pvVar36 = local_4e8;
            }
          }
          pvVar36 = (pointer)((long)&(pvVar36->super__Vector_base<double,_std::allocator<double>_>).
                                     _M_impl.super__Vector_impl_data._M_start + 1);
        } while (pvVar36 != (pointer)0x10);
        pdVar27 = (pointer)((long)pdVar27 + 1);
        pvVar36 = (pointer)0x1;
      } while (pdVar27 != (pointer)0x10);
      pMVar19 = (Molecule *)((long)&local_460->_vptr_Molecule + 1);
      pdVar27 = (pointer)0x1;
    } while (pMVar19 != (Molecule *)0x9);
    *local_b8 = (double)local_4f8 + *local_b8;
    if (local_1a8.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_1a8.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_1a8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1a8.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_190.
        super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>.
        _M_impl.super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_190.
                      super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                      ._M_impl.super__Vector_impl_data._M_start,
                      (long)local_190.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_190.
                            super__Vector_base<OpenMD::Vector3<double>,_std::allocator<OpenMD::Vector3<double>_>_>
                            ._M_impl.super__Vector_impl_data._M_start);
    }
    if (local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_318.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_300.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2e8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2d0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2b8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (double *)0x0) {
      operator_delete(local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_2a0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3c8.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_3b0.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_178.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    if (local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_start,
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_end_of_storage -
                      (long)local_160.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                            super__Vector_impl_data._M_start);
    }
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_358);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_448);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_428);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_408);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_3e8);
    std::
    vector<std::vector<double,_std::allocator<double>_>,_std::allocator<std::vector<double,_std::allocator<double>_>_>_>
    ::~vector(&local_288);
    __s = local_4e0;
  }
  operator_delete(__s,0x1a0);
  return;
}

Assistant:

void Electrostatic::ReciprocalSpaceSum(RealType& pot) {
    RealType kPot = 0.0;
    RealType kVir = 0.0;
    // Mat3x3d kVirTens(0.0);

    const RealType mPoleConverter = 0.20819434;  // converts from the
                                                 // internal units of
                                                 // Debye (for dipoles)
                                                 // or Debye-angstroms
                                                 // (for quadrupoles) to
                                                 // electron angstroms or
                                                 // electron-angstroms^2

    const RealType eConverter = 332.0637778;  // convert the
                                              // Charge-Charge
                                              // electrostatic
                                              // interactions into kcal /
                                              // mol assuming distances
                                              // are measured in
                                              // angstroms.

    Mat3x3d hmat = info_->getSnapshotManager()->getCurrentSnapshot()->getHmat();
    Vector3d box = hmat.diagonals();
    RealType boxMax = box.max();

    // int kMax = int(2.0 * Constants::PI / (pow(dampingAlpha_,2)*cutoffRadius_
    // * boxMax) );
    int kMax   = 7;
    int kSqMax = kMax * kMax + 2;

    int kLimit = kMax + 1;
    int kLim2  = 2 * kMax + 1;
    int kSqLim = kSqMax;

    vector<RealType> AK(kSqLim + 1, 0.0);
    RealType xcl  = 2.0 * Constants::PI / box.x();
    RealType ycl  = 2.0 * Constants::PI / box.y();
    RealType zcl  = 2.0 * Constants::PI / box.z();
    RealType rcl  = 2.0 * Constants::PI / boxMax;
    RealType rvol = 2.0 * Constants::PI / (box.x() * box.y() * box.z());

    if (dampingAlpha_ < 1.0e-12) return;

    RealType ralph = -0.25 / pow(dampingAlpha_, 2);

    // Calculate and store exponential factors

    vector<vector<RealType>> elc;
    vector<vector<RealType>> emc;
    vector<vector<RealType>> enc;
    vector<vector<RealType>> els;
    vector<vector<RealType>> ems;
    vector<vector<RealType>> ens;

    int nMax = info_->getNAtoms();

    elc.resize(kLimit + 1);
    emc.resize(kLimit + 1);
    enc.resize(kLimit + 1);
    els.resize(kLimit + 1);
    ems.resize(kLimit + 1);
    ens.resize(kLimit + 1);

    for (int j = 0; j < kLimit + 1; j++) {
      elc[j].resize(nMax);
      emc[j].resize(nMax);
      enc[j].resize(nMax);
      els[j].resize(nMax);
      ems[j].resize(nMax);
      ens[j].resize(nMax);
    }

    Vector3d t(2.0 * Constants::PI);
    t.Vdiv(t, box);

    SimInfo::MoleculeIterator mi;
    Molecule::AtomIterator ai;
    int i;
    Vector3d r;
    Vector3d tt;

    for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
         mol           = info_->nextMolecule(mi)) {
      for (Atom* atom = mol->beginAtom(ai); atom != NULL;
           atom       = mol->nextAtom(ai)) {
        i = atom->getLocalIndex();
        r = atom->getPos();
        info_->getSnapshotManager()->getCurrentSnapshot()->wrapVector(r);

        tt.Vmul(t, r);

        elc[1][i] = 1.0;
        emc[1][i] = 1.0;
        enc[1][i] = 1.0;
        els[1][i] = 0.0;
        ems[1][i] = 0.0;
        ens[1][i] = 0.0;

        elc[2][i] = cos(tt.x());
        emc[2][i] = cos(tt.y());
        enc[2][i] = cos(tt.z());
        els[2][i] = sin(tt.x());
        ems[2][i] = sin(tt.y());
        ens[2][i] = sin(tt.z());

        for (int l = 3; l <= kLimit; l++) {
          elc[l][i] = elc[l - 1][i] * elc[2][i] - els[l - 1][i] * els[2][i];
          emc[l][i] = emc[l - 1][i] * emc[2][i] - ems[l - 1][i] * ems[2][i];
          enc[l][i] = enc[l - 1][i] * enc[2][i] - ens[l - 1][i] * ens[2][i];
          els[l][i] = els[l - 1][i] * elc[2][i] + elc[l - 1][i] * els[2][i];
          ems[l][i] = ems[l - 1][i] * emc[2][i] + emc[l - 1][i] * ems[2][i];
          ens[l][i] = ens[l - 1][i] * enc[2][i] + enc[l - 1][i] * ens[2][i];
        }
      }
    }

    // Calculate and store AK coefficients:

    RealType eksq = 1.0;
    RealType expf = 0.0;
    if (ralph < 0.0) expf = exp(ralph * rcl * rcl);
    for (i = 1; i <= kSqLim; i++) {
      RealType rksq = float(i) * rcl * rcl;
      eksq          = expf * eksq;
      AK[i]         = eConverter * eksq / rksq;
    }

    /*
     * Loop over all k vectors k = 2 pi (ll/Lx, mm/Ly, nn/Lz)
     * the values of ll, mm and nn are selected so that the symmetry of
     * reciprocal lattice is taken into account i.e. the following
     * rules apply.
     *
     * ll ranges over the values 0 to kMax only.
     *
     * mm ranges over 0 to kMax when ll=0 and over
     *            -kMax to kMax otherwise.
     * nn ranges over 1 to kMax when ll=mm=0 and over
     *            -kMax to kMax otherwise.
     *
     * Hence the result of the summation must be doubled at the end.
     */

    std::vector<RealType> clm(nMax, 0.0);
    std::vector<RealType> slm(nMax, 0.0);
    std::vector<RealType> ckr(nMax, 0.0);
    std::vector<RealType> skr(nMax, 0.0);
    std::vector<RealType> ckc(nMax, 0.0);
    std::vector<RealType> cks(nMax, 0.0);
    std::vector<RealType> dkc(nMax, 0.0);
    std::vector<RealType> dks(nMax, 0.0);
    std::vector<RealType> qkc(nMax, 0.0);
    std::vector<RealType> qks(nMax, 0.0);
    std::vector<Vector3d> dxk(nMax, V3Zero);
    std::vector<Vector3d> qxk(nMax, V3Zero);
    RealType rl, rm, rn;
    Vector3d kVec;
    Vector3d Qk;
    // RealType k2;
    Mat3x3d Kmat;
    RealType ckcs, ckss, dkcs, dkss, qkcs, qkss;
    int atid;
    ElectrostaticAtomData data;
    RealType C, dk, qk;
    Vector3d D;
    Mat3x3d Q;

    int mMin = kLimit;
    int nMin = kLimit + 1;
    for (int l = 1; l <= kLimit; l++) {
      int ll = l - 1;
      rl     = xcl * float(ll);
      for (int mmm = mMin; mmm <= kLim2; mmm++) {
        int mm = mmm - kLimit;
        int m  = abs(mm) + 1;
        rm     = ycl * float(mm);
        // Set temporary products of exponential terms
        for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
             mol           = info_->nextMolecule(mi)) {
          for (Atom* atom = mol->beginAtom(ai); atom != NULL;
               atom       = mol->nextAtom(ai)) {
            i = atom->getLocalIndex();
            if (mm < 0) {
              clm[i] = elc[l][i] * emc[m][i] + els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] - ems[m][i] * elc[l][i];
            } else {
              clm[i] = elc[l][i] * emc[m][i] - els[l][i] * ems[m][i];
              slm[i] = els[l][i] * emc[m][i] + ems[m][i] * elc[l][i];
            }
          }
        }
        for (int nnn = nMin; nnn <= kLim2; nnn++) {
          int nn = nnn - kLimit;
          int n  = abs(nn) + 1;
          rn     = zcl * float(nn);
          // Test on magnitude of k vector:
          int kk = ll * ll + mm * mm + nn * nn;
          if (kk <= kSqLim) {
            kVec = Vector3d(rl, rm, rn);
            // k2     = dot(kVec, kVec);  // length^2 of kVec
            Kmat = outProduct(kVec, kVec);  // kMatrix
            // Calculate exp(ikr) terms
            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i = atom->getLocalIndex();

                if (nn < 0) {
                  ckr[i] = clm[i] * enc[n][i] + slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] - clm[i] * ens[n][i];

                } else {
                  ckr[i] = clm[i] * enc[n][i] - slm[i] * ens[n][i];
                  skr[i] = slm[i] * enc[n][i] + clm[i] * ens[n][i];
                }
              }
            }

            // Calculate scalar and vector products for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i        = atom->getLocalIndex();
                int atid = atom->getAtomType()->getIdent();
                data     = ElectrostaticMap[Etids[atid]];

                if (data.is_Charge) {
                  C = data.fixedCharge;
                  if (data.is_Fluctuating) C += atom->getFlucQPos();
                  ckc[i] = C * ckr[i];
                  cks[i] = C * skr[i];
                }

                if (data.is_Dipole) {
                  D      = atom->getDipole() * mPoleConverter;
                  dk     = dot(D, kVec);
                  dxk[i] = cross(D, kVec);
                  dkc[i] = dk * ckr[i];
                  dks[i] = dk * skr[i];
                }
                if (data.is_Quadrupole) {
                  Q      = atom->getQuadrupole() * mPoleConverter;
                  Qk     = Q * kVec;
                  qk     = dot(kVec, Qk);
                  qxk[i] = -cross(kVec, Qk);
                  qkc[i] = qk * ckr[i];
                  qks[i] = qk * skr[i];
                }
              }
            }

            // calculate vector sums

            ckcs = std::accumulate(ckc.begin(), ckc.end(), 0.0);
            ckss = std::accumulate(cks.begin(), cks.end(), 0.0);
            dkcs = std::accumulate(dkc.begin(), dkc.end(), 0.0);
            dkss = std::accumulate(dks.begin(), dks.end(), 0.0);
            qkcs = std::accumulate(qkc.begin(), qkc.end(), 0.0);
            qkss = std::accumulate(qks.begin(), qks.end(), 0.0);

#ifdef IS_MPI
            MPI_Allreduce(MPI_IN_PLACE, &ckcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &ckss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &dkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkcs, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
            MPI_Allreduce(MPI_IN_PLACE, &qkss, 1, MPI_REALTYPE, MPI_SUM,
                          MPI_COMM_WORLD);
#endif

            // Accumulate potential energy and virial contribution:

            kPot += 2.0 * rvol * AK[kk] *
                    ((ckss + dkcs - qkss) * (ckss + dkcs - qkss) +
                     (ckcs - dkss - qkcs) * (ckcs - dkss - qkcs));

            kVir +=
                2.0 * rvol * AK[kk] *
                (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss) +
                 3.0 * (dkcs * dkcs + dkss * dkss) -
                 6.0 * (ckss * qkss + ckcs * qkcs) +
                 8.0 * (dkss * qkcs - dkcs * qkss) +
                 5.0 * (qkss * qkss + qkcs * qkcs));

            // kVirTens += 2 * rvol * AK[kk] *
            //   ( Mat3x3d::identity() - 2.0*( 1.0 / k2 - ralph) * Kmat ) *
            //   (ckcs * ckcs + ckss * ckss + 4.0 * (ckss * dkcs - ckcs * dkss)
            //   +
            //    3.0 * (dkcs * dkcs + dkss * dkss) -
            //    6.0 * (ckss * qkss + ckcs * qkcs) +
            //    8.0 * (dkss * qkcs - dkcs * qkss) +
            //    5.0 * (qkss * qkss + qkcs * qkcs));

            // Calculate force and torque for each site:

            for (Molecule* mol = info_->beginMolecule(mi); mol != NULL;
                 mol           = info_->nextMolecule(mi)) {
              for (Atom* atom = mol->beginAtom(ai); atom != NULL;
                   atom       = mol->nextAtom(ai)) {
                i    = atom->getLocalIndex();
                atid = atom->getAtomType()->getIdent();
                data = ElectrostaticMap[Etids[atid]];

                RealType qfrc =
                    AK[kk] *
                    ((cks[i] + dkc[i] - qks[i]) * (ckcs - dkss - qkcs) -
                     (ckc[i] - dks[i] - qkc[i]) * (ckss + dkcs - qkss));
                RealType qtrq1 = AK[kk] * (skr[i] * (ckcs - dkss - qkcs) -
                                           ckr[i] * (ckss + dkcs - qkss));
                RealType qtrq2 = 2.0 * AK[kk] *
                                 (ckr[i] * (ckcs - dkss - qkcs) +
                                  skr[i] * (ckss + dkcs - qkss));

                atom->addFrc(4.0 * rvol * qfrc * kVec);

                if (data.is_Fluctuating) {
                  atom->addFlucQFrc(-2.0 * rvol * qtrq2);
                }

                if (data.is_Dipole) {
                  atom->addTrq(4.0 * rvol * qtrq1 * dxk[i]);
                }
                if (data.is_Quadrupole) {
                  atom->addTrq(4.0 * rvol * qtrq2 * qxk[i]);
                }
              }
            }
          }
        }
        nMin = 1;
      }
      mMin = 1;
    }
    pot += kPot;
    //    virialTensor += kVirTens;
  }